

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign_fwd.h
# Opt level: O3

void dlib::
     matrix_assign_big<dlib::assignable_ptr_matrix<float>,dlib::matrix_add_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>>>
               (assignable_ptr_matrix<float> *dest,
               matrix_exp<dlib::matrix_add_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>_>
               *src)

{
  float fVar1;
  long *plVar2;
  long lVar3;
  long r;
  const_ret_type cVar4;
  
  plVar2 = *(long **)src;
  if (0 < plVar2[1]) {
    r = 0;
    do {
      fVar1 = *(float *)(*plVar2 + plVar2[3] * r * 4);
      cVar4 = op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
              ::apply(*(op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
                        **)(src + 8),r,0);
      lVar3 = dest->width * r;
      r = r + 1;
      dest->ptr[lVar3] = cVar4 + fVar1;
      plVar2 = *(long **)src;
    } while (r < plVar2[1]);
  }
  return;
}

Assistant:

inline typename enable_if_c<ma::is_small_matrix<src_exp>::value && ma::is_very_small_matrix<src_exp>::value==true >::type matrix_assign (
        matrix_dest_type& dest,
        const matrix_exp<src_exp>& src
    )
    /*!
        requires
            - src.destructively_aliases(dest) == false
            - dest.nr() == src.nr()
            - dest.nc() == src.nc()
        ensures
            - #dest == src
    !*/
    {
        matrix_assign_unrolled(dest,src.ref());
    }